

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixml.c
# Opt level: O3

char * ixmlPrintNode(IXML_Node_conflict *node)

{
  ixml_membuf memBuf;
  ixml_membuf local_30;
  
  if (node != (IXML_Node_conflict *)0x0) {
    ixml_membuf_init(&local_30);
    ixmlPrintDomTree(node,&local_30);
    return local_30.buf;
  }
  return (char *)0x0;
}

Assistant:

DOMString ixmlPrintNode(IXML_Node *node)
{
	ixml_membuf memBuf;
	ixml_membuf *buf = &memBuf;

	if (node == NULL) {
		return NULL;
	}

	ixml_membuf_init(buf);
	ixmlPrintDomTree(node, buf);

	return buf->buf;
}